

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

void If_CutPrint(If_Cut_t *pCut)

{
  int iVar1;
  char *pcVar2;
  uint local_14;
  uint i;
  If_Cut_t *pCut_local;
  
  Abc_Print(1,"{");
  for (local_14 = 0; local_14 < *(uint *)&pCut->field_0x1c >> 0x18; local_14 = local_14 + 1) {
    iVar1 = If_CutLeafBit(pCut,local_14);
    pcVar2 = "";
    if (iVar1 != 0) {
      pcVar2 = "!";
    }
    Abc_Print(1," %s%d",pcVar2,(ulong)(uint)(&pCut[1].Area)[local_14]);
  }
  Abc_Print(1," }\n");
  return;
}

Assistant:

void If_CutPrint( If_Cut_t * pCut )
{
    unsigned i;
    Abc_Print( 1, "{" );
    for ( i = 0; i < pCut->nLeaves; i++ )
        Abc_Print( 1, " %s%d", If_CutLeafBit(pCut, i) ? "!":"", pCut->pLeaves[i] );
    Abc_Print( 1, " }\n" );
}